

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cpp
# Opt level: O3

void dlib::impl2::read_thread
               (bsp_con *con,unsigned_long node_id,unsigned_long sender_id,
               thread_safe_message_queue *msg_buffer)

{
  iostream *in;
  char cVar1;
  vector<char,_std::allocator<char>_> *__p;
  msg_data msg_1;
  msg_data msg;
  msg_data local_1a8 [9];
  
  in = &con->stream;
  do {
    local_1a8[0].data.
    super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (vector<char,_std::allocator<char>_> *)0x0;
    local_1a8[0].data.
    super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1a8[0].sender_id = 0xffffffff;
    local_1a8[0].msg_type = -1;
    local_1a8[0].epoch = 0;
    deserialize(&local_1a8[0].msg_type,&in->super_basic_istream<char,_std::char_traits<char>_>);
    local_1a8[0].sender_id = sender_id;
    if (local_1a8[0].msg_type == '\0') {
      __p = (vector<char,_std::allocator<char>_> *)operator_new(0x18);
      (__p->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (__p->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (__p->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__shared_ptr<std::vector<char,std::allocator<char>>,(__gnu_cxx::_Lock_policy)2>::
      reset<std::vector<char,std::allocator<char>>>
                ((__shared_ptr<std::vector<char,std::allocator<char>>,(__gnu_cxx::_Lock_policy)2> *)
                 local_1a8,__p);
      deserialize(&local_1a8[0].epoch,&in->super_basic_istream<char,_std::char_traits<char>_>);
      deserialize<std::allocator<char>>
                (local_1a8[0].data.
                 super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,&in->super_basic_istream<char,_std::char_traits<char>_>);
    }
    impl1::thread_safe_message_queue::push_and_consume(msg_buffer,local_1a8);
    cVar1 = local_1a8[0].msg_type;
    if (local_1a8[0].data.
        super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a8[0].data.
                 super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  } while (cVar1 != '\x05');
  return;
}

Assistant:

void read_thread (
            impl1::bsp_con* con,
            unsigned long node_id,
            unsigned long sender_id,
            impl1::thread_safe_message_queue& msg_buffer
        )
        {
            try
            {
                while(true)
                {
                    impl1::msg_data msg;
                    deserialize(msg.msg_type, con->stream);
                    msg.sender_id = sender_id;

                    if (msg.msg_type == MESSAGE_HEADER)
                    {
                        msg.data.reset(new std::vector<char>);
                        deserialize(msg.epoch, con->stream);
                        deserialize(*msg.data, con->stream);
                    }

                    msg_buffer.push_and_consume(msg);

                    if (msg.msg_type == NODE_TERMINATE)
                        break;
                }
            }
            catch (std::exception& e)
            {
                impl1::msg_data msg;
                msg.data.reset(new std::vector<char>);
                vectorstream sout(*msg.data);
                sout << "An exception was thrown while attempting to receive a message from processing node " << sender_id << ".\n";
                sout << "  Sending processing node address:   " << con->con->get_foreign_ip() << ":" << con->con->get_foreign_port() << std::endl;
                sout << "  Receiving processing node address: " << con->con->get_local_ip() << ":" << con->con->get_local_port() << std::endl;
                sout << "  Receiving processing node id:      " << node_id << std::endl;
                sout << "  Error message in the exception:    " << e.what() << std::endl;

                msg.sender_id = sender_id;
                msg.msg_type = READ_ERROR;

                msg_buffer.push_and_consume(msg);
            }
            catch (...)
            {
                impl1::msg_data msg;
                msg.data.reset(new std::vector<char>);
                vectorstream sout(*msg.data);
                sout << "An exception was thrown while attempting to receive a message from processing node " << sender_id << ".\n";
                sout << "  Sending processing node address:   " << con->con->get_foreign_ip() << ":" << con->con->get_foreign_port() << std::endl;
                sout << "  Receiving processing node address: " << con->con->get_local_ip() << ":" << con->con->get_local_port() << std::endl;
                sout << "  Receiving processing node id:      " << node_id << std::endl;

                msg.sender_id = sender_id;
                msg.msg_type = READ_ERROR;

                msg_buffer.push_and_consume(msg);
            }
        }